

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  runtime_error *this_00;
  reference ppVar2;
  ArrayIndex in_ESI;
  long in_RDI;
  const_iterator it;
  CZString key;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff78;
  CZString *this_01;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_50;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_40;
  CZString local_38 [3];
  Value *local_8;
  
  if (((*(ushort *)(in_RDI + 8) & 0xff) != 0) && ((*(ushort *)(in_RDI + 8) & 0xff) != 6)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(ushort *)(in_RDI + 8) & 0xff) == 0) {
    local_8 = (Value *)kNull;
  }
  else {
    this_01 = local_38;
    CZString::CZString(this_01,in_ESI);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find(in_stack_ffffffffffffff78,(key_type *)0x1297f5);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_40,&local_48);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end(in_stack_ffffffffffffff78);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_50,&local_58);
    bVar1 = std::operator==(&local_40,&local_50);
    if (bVar1) {
      local_8 = (Value *)kNull;
    }
    else {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          *)this_01);
      local_8 = &ppVar2->second;
    }
    CZString::~CZString(this_01);
  }
  return local_8;
}

Assistant:

const Value& Value::operator[](ArrayIndex index) const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
  if (type_ == nullValue)
    return null;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString key(index);
  ObjectValues::const_iterator it = value_.map_->find(key);
  if (it == value_.map_->end())
    return null;
  return (*it).second;
#else
  Value* value = value_.array_->find(index);
  return value ? *value : null;
#endif
}